

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClockInference.cpp
# Opt level: O3

void __thiscall
slang::analysis::SampledValueFuncVisitor::visit<slang::ast::InsideExpression>
          (SampledValueFuncVisitor *this,InsideExpression *expr)

{
  bool bVar1;
  KnownSystemName KVar2;
  int *piVar3;
  Diagnostic *this_00;
  string_view arg;
  
  bVar1 = ClockInference::isSampledValueFuncCall(&expr->super_Expression);
  if (!bVar1) {
    ast::InsideExpression::visitExprs<slang::analysis::SampledValueFuncVisitor&>(expr,this);
    return;
  }
  KVar2 = ast::CallExpression::getKnownSystemName((CallExpression *)expr);
  if (KVar2 == Past) {
    if (expr[1].left_ != (Expression *)0x4) goto LAB_001431e2;
    piVar3 = *(int **)((long)expr[1].super_Expression.sourceRange.endLoc + 0x18);
  }
  else {
    if (expr[1].left_ != (Expression *)0x2) goto LAB_001431e2;
    piVar3 = *(int **)((long)expr[1].super_Expression.sourceRange.endLoc + 8);
  }
  if (*piVar3 != 0x1e) {
    return;
  }
LAB_001431e2:
  this_00 = AnalysisContext::addDiag
                      (this->context,this->parentSymbol,(DiagCode)0x8000e,
                       (expr->super_Expression).sourceRange);
  arg = ast::CallExpression::getSubroutineName((CallExpression *)expr);
  Diagnostic::operator<<(this_00,arg);
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            if (ClockInference::isSampledValueFuncCall(expr)) {
                auto& call = expr.template as<CallExpression>();
                bool hasClock;
                if (call.getKnownSystemName() == KnownSystemName::Past) {
                    hasClock = call.arguments().size() == 4 &&
                               call.arguments()[3]->kind != ExpressionKind::EmptyArgument;
                }
                else {
                    hasClock = call.arguments().size() == 2 &&
                               call.arguments()[1]->kind != ExpressionKind::EmptyArgument;
                }

                if (!hasClock) {
                    context.addDiag(parentSymbol, diag::SampledValueFuncClock, call.sourceRange)
                        << call.getSubroutineName();
                }
            }
            else if constexpr (HasVisitExprs<T, SampledValueFuncVisitor>) {
                expr.visitExprs(*this);
            }
        }
    }